

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstack.h
# Opt level: O0

void __thiscall
TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>::
push_back(TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object)

{
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object_00;
  TPZStack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10>
  *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  object_00 = &local_30;
  std::__cxx11::string::string((string *)object_00,in_RSI);
  Push(in_stack_ffffffffffffffc0,object_00);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void push_back(const T object)
    {
        Push(object);
    }